

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O2

void SVRG::predict(svrg *s,single_learner *param_2,example *ec)

{
  float fVar1;
  
  fVar1 = inline_predict<0>(s->all,ec);
  ec->partial_prediction = fVar1;
  fVar1 = GD::finalize_prediction(s->all->sd,fVar1);
  (ec->pred).scalar = fVar1;
  return;
}

Assistant:

void predict(svrg& s, single_learner&, example& ec)
{
  ec.partial_prediction = inline_predict<W_INNER>(*s.all, ec);
  ec.pred.scalar = GD::finalize_prediction(s.all->sd, ec.partial_prediction);
}